

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O0

int X509V3_EXT_add_alias(int nid_to,int nid_from)

{
  int iVar1;
  X509V3_EXT_METHOD *__src;
  X509V3_EXT_METHOD *ext_00;
  X509V3_EXT_METHOD *tmpext;
  X509V3_EXT_METHOD *ext;
  int nid_from_local;
  int nid_to_local;
  
  __src = X509V3_EXT_get_nid(nid_from);
  if (__src == (X509V3_EXT_METHOD *)0x0) {
    ERR_put_error(0x14,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_lib.cc"
                  ,0x6f);
    nid_from_local = 0;
  }
  else {
    ext_00 = (X509V3_EXT_METHOD *)OPENSSL_malloc(0x68);
    if (ext_00 == (X509V3_EXT_METHOD *)0x0) {
      nid_from_local = 0;
    }
    else {
      memcpy(ext_00,__src,0x68);
      ext_00->ext_nid = nid_to;
      iVar1 = X509V3_EXT_add(ext_00);
      if (iVar1 == 0) {
        OPENSSL_free(ext_00);
        nid_from_local = 0;
      }
      else {
        nid_from_local = 1;
      }
    }
  }
  return nid_from_local;
}

Assistant:

int X509V3_EXT_add_alias(int nid_to, int nid_from) {
  OPENSSL_BEGIN_ALLOW_DEPRECATED
  const X509V3_EXT_METHOD *ext;
  X509V3_EXT_METHOD *tmpext;

  if (!(ext = X509V3_EXT_get_nid(nid_from))) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_NOT_FOUND);
    return 0;
  }
  if (!(tmpext =
            (X509V3_EXT_METHOD *)OPENSSL_malloc(sizeof(X509V3_EXT_METHOD)))) {
    return 0;
  }
  *tmpext = *ext;
  tmpext->ext_nid = nid_to;
  if (!X509V3_EXT_add(tmpext)) {
    OPENSSL_free(tmpext);
    return 0;
  }
  return 1;
  OPENSSL_END_ALLOW_DEPRECATED
}